

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O1

void mini_fuzz_recycle_array_container_intersection_inplace(void)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  _Bool _Var7;
  uint16_t *buffer;
  uint16_t *buffer_00;
  uint16_t *buffer_01;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bitset_container_t *pbVar16;
  bitset_container_t *pbVar17;
  char *pcVar18;
  char *pcVar19;
  
  splitmix64_x = 0x3039;
  buffer = (uint16_t *)malloc(0x2000);
  buffer_00 = (uint16_t *)malloc(0x2000);
  buffer_01 = (uint16_t *)malloc(0x2000);
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  lVar11 = 0;
  do {
    bitset_container_clear(bitset);
    bitset_container_clear(bitset_00);
    bitset_container_clear(bitset_01);
    container->cardinality = 0;
    container_00->cardinality = 0;
    container_01->cardinality = 0;
    sVar8 = populate(buffer,0x1000);
    sVar9 = populate(buffer_00,0x1000);
    sVar10 = populate(buffer_01,0x1000);
    pbVar16 = bitset_01;
    if (sVar8 != 0) {
      uVar13 = 0;
      do {
        uVar1 = buffer[uVar13];
        iVar3 = container->cardinality;
        if (((long)iVar3 == 0) ||
           ((iVar3 != 0x7fffffff && (container->array[(long)iVar3 + -1] < uVar1)))) {
          if (iVar3 == container->capacity) {
            array_container_grow(container,container->capacity + 1,true);
          }
          iVar3 = container->cardinality;
          container->cardinality = iVar3 + 1;
          container->array[iVar3] = uVar1;
        }
        else {
          iVar12 = iVar3 + -1;
          uVar14 = 0;
          pbVar17 = pbVar16;
          do {
            if (iVar12 < (int)uVar14) {
              pbVar16 = (bitset_container_t *)(ulong)~uVar14;
              break;
            }
            uVar5 = uVar14 + iVar12 >> 1;
            pbVar16 = (bitset_container_t *)(ulong)uVar5;
            uVar2 = *(ushort *)((long)container->array + (ulong)(uVar14 + iVar12 & 0xfffffffe));
            if (uVar2 < uVar1) {
              uVar14 = uVar5 + 1;
              bVar6 = true;
              pbVar16 = pbVar17;
            }
            else if (uVar1 < uVar2) {
              iVar12 = uVar5 - 1;
              bVar6 = true;
              pbVar16 = pbVar17;
            }
            else {
              bVar6 = false;
            }
            pbVar17 = pbVar16;
          } while (bVar6);
          if ((iVar3 != 0x7fffffff) && ((int)(uint)pbVar16 < 0)) {
            if (iVar3 == container->capacity) {
              array_container_grow(container,container->capacity + 1,true);
            }
            uVar14 = ~(uint)pbVar16;
            pbVar16 = (bitset_container_t *)(ulong)uVar14;
            memmove(container->array + (long)((long)&pbVar16->cardinality + 1),
                    container->array + (long)pbVar16,(long)(int)(iVar3 - uVar14) * 2);
            container->array[(long)pbVar16] = uVar1;
            container->cardinality = container->cardinality + 1;
          }
        }
        uVar4 = bitset->words[uVar1 >> 6];
        uVar15 = uVar4 | 1L << ((ulong)uVar1 & 0x3f);
        bitset->cardinality = bitset->cardinality + (int)((uVar4 ^ uVar15) >> ((byte)uVar1 & 0x3f));
        bitset->words[uVar1 >> 6] = uVar15;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < sVar8);
    }
    if (sVar9 != 0) {
      uVar13 = 0;
      do {
        uVar1 = buffer_00[uVar13];
        iVar3 = container_00->cardinality;
        if (((long)iVar3 == 0) ||
           ((iVar3 != 0x7fffffff && (container_00->array[(long)iVar3 + -1] < uVar1)))) {
          if (iVar3 == container_00->capacity) {
            array_container_grow(container_00,container_00->capacity + 1,true);
          }
          iVar3 = container_00->cardinality;
          container_00->cardinality = iVar3 + 1;
          container_00->array[iVar3] = uVar1;
        }
        else {
          iVar12 = iVar3 + -1;
          uVar14 = 0;
          pbVar17 = pbVar16;
          do {
            if (iVar12 < (int)uVar14) {
              pbVar16 = (bitset_container_t *)(ulong)~uVar14;
              break;
            }
            uVar5 = uVar14 + iVar12 >> 1;
            pbVar16 = (bitset_container_t *)(ulong)uVar5;
            uVar2 = *(ushort *)((long)container_00->array + (ulong)(uVar14 + iVar12 & 0xfffffffe));
            if (uVar2 < uVar1) {
              uVar14 = uVar5 + 1;
              bVar6 = true;
              pbVar16 = pbVar17;
            }
            else if (uVar1 < uVar2) {
              iVar12 = uVar5 - 1;
              bVar6 = true;
              pbVar16 = pbVar17;
            }
            else {
              bVar6 = false;
            }
            pbVar17 = pbVar16;
          } while (bVar6);
          if ((iVar3 != 0x7fffffff) && ((int)(uint)pbVar16 < 0)) {
            if (iVar3 == container_00->capacity) {
              array_container_grow(container_00,container_00->capacity + 1,true);
            }
            uVar14 = ~(uint)pbVar16;
            pbVar16 = (bitset_container_t *)(ulong)uVar14;
            memmove(container_00->array + (long)((long)&pbVar16->cardinality + 1),
                    container_00->array + (long)pbVar16,(long)(int)(iVar3 - uVar14) * 2);
            container_00->array[(long)pbVar16] = uVar1;
            container_00->cardinality = container_00->cardinality + 1;
          }
        }
        uVar4 = bitset_00->words[uVar1 >> 6];
        uVar15 = uVar4 | 1L << ((ulong)uVar1 & 0x3f);
        bitset_00->cardinality =
             bitset_00->cardinality + (int)((uVar4 ^ uVar15) >> ((byte)uVar1 & 0x3f));
        bitset_00->words[uVar1 >> 6] = uVar15;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < sVar9);
    }
    if (sVar10 != 0) {
      uVar13 = 0;
      do {
        uVar1 = buffer_01[uVar13];
        iVar3 = container_01->cardinality;
        if (((long)iVar3 == 0) ||
           ((iVar3 != 0x7fffffff && (container_01->array[(long)iVar3 + -1] < uVar1)))) {
          if (iVar3 == container_01->capacity) {
            array_container_grow(container_01,container_01->capacity + 1,true);
          }
          iVar3 = container_01->cardinality;
          container_01->cardinality = iVar3 + 1;
          container_01->array[iVar3] = uVar1;
        }
        else {
          iVar12 = iVar3 + -1;
          uVar14 = 0;
          pbVar17 = pbVar16;
          do {
            if (iVar12 < (int)uVar14) {
              pbVar16 = (bitset_container_t *)(ulong)~uVar14;
              break;
            }
            uVar5 = uVar14 + iVar12 >> 1;
            pbVar16 = (bitset_container_t *)(ulong)uVar5;
            uVar2 = *(ushort *)((long)container_01->array + (ulong)(uVar14 + iVar12 & 0xfffffffe));
            if (uVar2 < uVar1) {
              uVar14 = uVar5 + 1;
              bVar6 = true;
              pbVar16 = pbVar17;
            }
            else if (uVar1 < uVar2) {
              iVar12 = uVar5 - 1;
              bVar6 = true;
              pbVar16 = pbVar17;
            }
            else {
              bVar6 = false;
            }
            pbVar17 = pbVar16;
          } while (bVar6);
          if ((iVar3 != 0x7fffffff) && ((int)(uint)pbVar16 < 0)) {
            if (iVar3 == container_01->capacity) {
              array_container_grow(container_01,container_01->capacity + 1,true);
            }
            uVar14 = ~(uint)pbVar16;
            pbVar16 = (bitset_container_t *)(ulong)uVar14;
            memmove(container_01->array + (long)((long)&pbVar16->cardinality + 1),
                    container_01->array + (long)pbVar16,(long)(int)(iVar3 - uVar14) * 2);
            container_01->array[(long)pbVar16] = uVar1;
            container_01->cardinality = container_01->cardinality + 1;
          }
        }
        uVar4 = bitset_01->words[uVar1 >> 6];
        uVar15 = uVar4 | 1L << ((ulong)uVar1 & 0x3f);
        bitset_01->cardinality =
             bitset_01->cardinality + (int)((uVar4 ^ uVar15) >> ((byte)uVar1 & 0x3f));
        bitset_01->words[uVar1 >> 6] = uVar15;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < sVar10);
    }
    bitset->cardinality = -1;
    array_container_intersection_inplace(container,container_00);
    bitset_container_and_nocard(bitset,bitset_00,bitset);
    _Var7 = array_container_equal_bitset(container,bitset);
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
    ;
    _assert_true((ulong)_Var7,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x14e);
    array_container_intersection_inplace(container,container_01);
    bitset_container_and_nocard(bitset,bitset_01,bitset);
    _Var7 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var7,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x152);
    if (sVar8 != 0) {
      uVar13 = 0;
      do {
        uVar1 = buffer[uVar13];
        iVar3 = container->cardinality;
        if (((long)iVar3 == 0) ||
           ((iVar3 != 0x7fffffff && (container->array[(long)iVar3 + -1] < uVar1)))) {
          if (iVar3 == container->capacity) {
            array_container_grow(container,container->capacity + 1,true);
          }
          iVar3 = container->cardinality;
          container->cardinality = iVar3 + 1;
          container->array[iVar3] = uVar1;
        }
        else {
          iVar12 = iVar3 + -1;
          uVar14 = 0;
          pcVar19 = pcVar18;
          do {
            if (iVar12 < (int)uVar14) {
              pcVar18 = (char *)(ulong)~uVar14;
              break;
            }
            uVar5 = uVar14 + iVar12 >> 1;
            pcVar18 = (char *)(ulong)uVar5;
            uVar2 = *(ushort *)((long)container->array + (ulong)(uVar14 + iVar12 & 0xfffffffe));
            if (uVar2 < uVar1) {
              uVar14 = uVar5 + 1;
              bVar6 = true;
              pcVar18 = pcVar19;
            }
            else if (uVar1 < uVar2) {
              iVar12 = uVar5 - 1;
              bVar6 = true;
              pcVar18 = pcVar19;
            }
            else {
              bVar6 = false;
            }
            pcVar19 = pcVar18;
          } while (bVar6);
          if ((iVar3 != 0x7fffffff) && ((int)(uint)pcVar18 < 0)) {
            if (iVar3 == container->capacity) {
              array_container_grow(container,container->capacity + 1,true);
            }
            uVar14 = ~(uint)pcVar18;
            pcVar18 = (char *)(ulong)uVar14;
            memmove(container->array + (long)(pcVar18 + 1),container->array + (long)pcVar18,
                    (long)(int)(iVar3 - uVar14) * 2);
            container->array[(long)pcVar18] = uVar1;
            container->cardinality = container->cardinality + 1;
          }
        }
        uVar4 = bitset->words[uVar1 >> 6];
        uVar15 = uVar4 | 1L << ((ulong)uVar1 & 0x3f);
        bitset->cardinality = bitset->cardinality + (int)((uVar4 ^ uVar15) >> ((byte)uVar1 & 0x3f));
        bitset->words[uVar1 >> 6] = uVar15;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < sVar8);
    }
    bitset->cardinality = -1;
    _Var7 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var7,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x159);
    array_container_intersection_inplace(container,container_00);
    bitset_container_and_nocard(bitset,bitset_00,bitset);
    _Var7 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var7,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x15d);
    array_container_intersection_inplace(container,container_01);
    bitset_container_and_nocard(bitset,bitset_01,bitset);
    _Var7 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var7,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x161);
    lVar11 = lVar11 + 1;
    if (lVar11 == 3000) {
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      bitset_container_free(bitset);
      bitset_container_free(bitset_00);
      bitset_container_free(bitset_01);
      free(buffer);
      free(buffer_00);
      free(buffer_01);
      return;
    }
  } while( true );
}

Assistant:

static inline void splitmix64_seed(uint64_t seed) { splitmix64_x = seed; }